

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

char * duplicate_stringlist(char *input)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  
  pcVar2 = input;
  if (input == (char *)0x0) {
    pcVar2 = strdup("");
    return pcVar2;
  }
  for (; *pcVar2 != '\0'; pcVar2 = pcVar2 + sVar1 + 1) {
    sVar1 = strlen(pcVar2);
  }
  __dest = malloc((size_t)(pcVar2 + (1 - (long)input)));
  if (__dest == (void *)0x0) {
    return (char *)0x0;
  }
  pcVar2 = (char *)memcpy(__dest,input,(size_t)(pcVar2 + (1 - (long)input)));
  return pcVar2;
}

Assistant:

static char *duplicate_stringlist(const char *input)
{
    if (input == NULL)
        return strdup("");

    char *result;
    const char *in_tail;

    for (in_tail = input; in_tail[0] != '\0'; in_tail += strlen(in_tail) + 1)
        ;
    ++in_tail;
    if ((result = malloc(in_tail - input)) == NULL)
        return NULL;
    memcpy(result, input, in_tail - input);
    return result;
}